

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tracker_connection.cpp
# Opt level: O2

void __thiscall libtorrent::aux::http_tracker_connection::start(http_tracker_connection *this)

{
  event_t eVar1;
  session_settings *psVar2;
  i2p_connection *piVar3;
  pointer paVar4;
  pointer paVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  io_context *__args_1;
  _Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::span<const_char>)>
  *__args_2;
  http_connection *this_00;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  string *psVar12;
  listen_socket_t *plVar13;
  element_type *in_RCX;
  pointer this_01;
  pointer this_02;
  proxy_settings *ps_00;
  basic_string_view<char,_std::char_traits<char>_> query_string;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  undefined1 local_581;
  session_settings *local_580;
  string url;
  listen_socket_handle ls;
  undefined1 local_534 [4];
  shared_ptr<libtorrent::aux::request_callback> cb;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_518 [6];
  bind_info_t bi;
  undefined1 local_4a8 [24];
  _Alloc_hider _Stack_490;
  string user_agent;
  string local_468;
  undefined1 local_448 [16];
  proxy_settings ps;
  
  ::std::__cxx11::string::string((string *)&url,(string *)&(this->super_tracker_connection).m_req);
  if (((this->super_tracker_connection).m_req.kind.m_val & 1) != 0) {
    uVar10 = ::std::__cxx11::string::find((char *)&url,0x38ebe8);
    if (uVar10 == 0xffffffffffffffff) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&ps,scrape_not_available,(type *)0x0);
      tracker_connection::fail
                (&this->super_tracker_connection,(error_code *)&ps,bittorrent,"",(seconds32)0x0,
                 (seconds32)0x0);
      goto LAB_001f8dfe;
    }
    in_RCX = (element_type *)0x38f9e5;
    ::std::__cxx11::string::replace((ulong)&url,uVar10,(char *)0x8);
  }
  bVar7 = is_i2p_url((string *)&url);
  psVar2 = ((this->super_tracker_connection).m_man)->m_settings;
  lVar11 = ::std::__cxx11::string::find((char)&url,0x3f);
  local_580 = psVar2;
  if (lVar11 == -1) {
    ::std::__cxx11::string::append((char *)&url);
  }
  else {
    bVar8 = session_settings::get_bool(psVar2,0x8050);
    if (bVar8) {
      in_RCX = (element_type *)CONCAT44(url._M_string_length._4_4_,(int)url._M_string_length);
      ps.hostname._M_string_length = (size_type)url._M_dataplus._M_p;
      ps.hostname._M_dataplus._M_p = (pointer)in_RCX;
      query_string = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)&ps,lVar11 + 1,
                                0xffffffffffffffff);
      bVar8 = has_tracker_query_string(query_string);
      if (bVar8) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&ps,ssrf_mitigation,(type *)0x0);
        tracker_connection::fail
                  (&this->super_tracker_connection,(error_code *)&ps,bittorrent,"",(seconds32)0x0,
                   (seconds32)0x0);
        goto LAB_001f8dfe;
      }
    }
    ::std::__cxx11::string::append((char *)&url);
  }
  ::std::__cxx11::string::append((char *)&url);
  str._M_str = (char *)in_RCX;
  str._M_len = (size_t)&(this->super_tracker_connection).m_req.info_hash;
  escape_string_abi_cxx11_(&ps.hostname,(libtorrent *)0x14,str);
  ::std::__cxx11::string::append((string *)&url);
  ::std::__cxx11::string::~string((string *)&ps);
  if (((this->super_tracker_connection).m_req.kind.m_val & 1) == 0) {
    str_00._M_str = (char *)in_RCX;
    str_00._M_len = (size_t)&(this->super_tracker_connection).m_req.pid;
    escape_string_abi_cxx11_((string *)&cb,(libtorrent *)0x14,str_00);
    in_RCX = cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    snprintf((char *)&ps,0x400,
             "&peer_id=%s&port=%d&uploaded=%ld&downloaded=%ld&left=%ld&corrupt=%ld&key=%08X%s%s&numwant=%d&compact=1&no_peer_id=1"
            );
    ::std::__cxx11::string::~string((string *)&cb);
    ::std::__cxx11::string::append((char *)&url);
    iVar9 = session_settings::get_int(local_580,0x4077);
    if ((iVar9 != 2) && (bVar8 = session_settings::get_bool(local_580,0x803a), bVar8)) {
      ::std::__cxx11::string::append((char *)&url);
    }
    bVar8 = session_settings::get_bool(local_580,0x8037);
    if (bVar8) {
      ::std::__cxx11::string::append((char *)&url);
      to_string((array<char,_22UL> *)&cb,(this->super_tracker_connection).m_req.redundant);
      ::std::__cxx11::string::append((char *)&url);
    }
    if ((this->super_tracker_connection).m_req.trackerid._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)&url);
      str_01._M_str = (char *)in_RCX;
      str_01._M_len = (size_t)(this->super_tracker_connection).m_req.trackerid._M_dataplus._M_p;
      escape_string_abi_cxx11_
                ((string *)&cb,
                 (libtorrent *)(this->super_tracker_connection).m_req.trackerid._M_string_length,
                 str_01);
      ::std::__cxx11::string::append((string *)&url);
      ::std::__cxx11::string::~string((string *)&cb);
    }
    if ((bVar7) &&
       (piVar3 = (this->super_tracker_connection).m_req.i2pconn, piVar3 != (i2p_connection *)0x0)) {
      if ((piVar3->m_i2p_local_endpoint)._M_string_length == 0) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&cb,no_i2p_endpoint,(type *)0x0);
        tracker_connection::fail
                  (&this->super_tracker_connection,(error_code *)&cb,bittorrent,
                   "Waiting for i2p acceptor from SAM bridge",(seconds32)0x5,(seconds32)0x0);
        goto LAB_001f8dfe;
      }
      ::std::operator+(&bi.device,"&ip=",&piVar3->m_i2p_local_endpoint);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cb,
                       &bi.device,".i2p");
      ::std::__cxx11::string::append((string *)&url);
LAB_001f87d6:
      ::std::__cxx11::string::~string((string *)&cb);
      ::std::__cxx11::string::~string((string *)&bi);
    }
    else {
      bVar8 = session_settings::get_bool(local_580,0x8026);
      if (!bVar8) {
        psVar12 = session_settings::get_str_abi_cxx11_(local_580,1);
        if ((libtorrent *)psVar12->_M_string_length != (libtorrent *)0x0) {
          str_02._M_str = (char *)in_RCX;
          str_02._M_len = (size_t)(psVar12->_M_dataplus)._M_p;
          escape_string_abi_cxx11_(&bi.device,(libtorrent *)psVar12->_M_string_length,str_02);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cb,
                           "&ip=",&bi.device);
          ::std::__cxx11::string::append((string *)&url);
          goto LAB_001f87d6;
        }
      }
    }
  }
  this_01 = (this->super_tracker_connection).m_req.ipv4.
            super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar4 = (this->super_tracker_connection).m_req.ipv4.
           super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != paVar4 && !bVar7) {
    for (; this_01 != paVar4; this_01 = this_01 + 1) {
      boost::asio::ip::address_v4::to_string_abi_cxx11_(&ps.hostname,this_01);
      ::std::__cxx11::string::append((char *)&url);
      str_03._M_str = (char *)in_RCX;
      str_03._M_len = (size_t)ps.hostname._M_dataplus._M_p;
      escape_string_abi_cxx11_((string *)&cb,(libtorrent *)ps.hostname._M_string_length,str_03);
      ::std::__cxx11::string::append((string *)&url);
      ::std::__cxx11::string::~string((string *)&cb);
      ::std::__cxx11::string::~string((string *)&ps);
    }
  }
  this_02 = (this->super_tracker_connection).m_req.ipv6.
            super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar5 = (this->super_tracker_connection).m_req.ipv6.
           super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_02 != paVar5 && !bVar7) {
    for (; this_02 != paVar5; this_02 = this_02 + 1) {
      boost::asio::ip::address_v6::to_string_abi_cxx11_(&ps.hostname,this_02);
      ::std::__cxx11::string::append((char *)&url);
      str_04._M_str = (char *)in_RCX;
      str_04._M_len = (size_t)ps.hostname._M_dataplus._M_p;
      escape_string_abi_cxx11_((string *)&cb,(libtorrent *)ps.hostname._M_string_length,str_04);
      ::std::__cxx11::string::append((string *)&url);
      ::std::__cxx11::string::~string((string *)&cb);
      ::std::__cxx11::string::~string((string *)&ps);
    }
  }
  if ((bVar7) ||
     ((p_Var6 = (this->super_tracker_connection).m_req.outgoing_socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi, p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
      (p_Var6->_M_use_count != 0)))) {
    __args_1 = this->m_ioc;
    __args_2 = (_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::span<const_char>)>
                *)((this->super_tracker_connection).m_man)->m_host_resolver;
    shared_from_this((http_tracker_connection *)&ls);
    ps.hostname._M_dataplus._M_p = (pointer)on_response;
    ps.hostname._M_string_length = 0;
    ps.hostname.field_2._M_allocated_capacity =
         (size_type)
         ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    ps.hostname.field_2._8_8_ =
         ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_581 = 1;
    local_534 = (undefined1  [4])session_settings::get_int(local_580,0x4073);
    shared_from_this((http_tracker_connection *)local_4a8);
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)on_connect;
    cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    a_Stack_518[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a8._8_8_;
    local_4a8._0_8_ = (_func_int **)0x0;
    local_4a8._8_8_ = 0;
    shared_from_this((http_tracker_connection *)(local_4a8 + 0x10));
    bi.device._M_dataplus._M_p = (pointer)on_filter;
    bi.device._M_string_length = 0;
    bi.device.field_2._M_allocated_capacity = local_4a8._16_8_;
    bi.device.field_2._8_8_ = _Stack_490._M_p;
    local_4a8._16_8_ = 0;
    _Stack_490._M_p = (pointer)0x0;
    shared_from_this((http_tracker_connection *)local_448);
    user_agent._M_dataplus._M_p = (pointer)on_filter_hostname;
    user_agent._M_string_length = 0;
    user_agent.field_2._M_allocated_capacity = local_448._0_8_;
    user_agent.field_2._8_8_ = local_448._8_8_;
    local_448._0_8_ = (element_type *)0x0;
    local_448._8_8_ = (element_type *)0x0;
    ::std::
    make_shared<libtorrent::aux::http_connection,boost::asio::io_context&,libtorrent::aux::resolver_interface&,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::span<char_const>)>,bool,int,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>))(libtorrent::aux::http_connection&)>,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::http_connection&,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>&)>,std::_Bind<bool(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::http_connection&,std::basic_string_view<char,std::char_traits<char>>)>,boost::asio::ssl::context*const&>
              ((io_context *)&local_468,(resolver_interface *)__args_1,__args_2,(bool *)&ps,
               (int *)&local_581,
               (_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>))(libtorrent::aux::http_connection_&)>
                *)local_534,
               (_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                *)&cb,(_Bind<bool_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&bi,(context **)&user_agent);
    ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_tracker_connection).
                super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &local_468);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_468._M_string_length);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&user_agent.field_2 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_448 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&bi.device.field_2 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_490);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_518);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4a8 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&ps.hostname.field_2 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ls.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    psVar2 = local_580;
    bVar7 = (this->super_tracker_connection).m_req.event == stopped;
    iVar9 = session_settings::get_int(local_580,bVar7 + 0x4000 + (uint)bVar7);
    bVar7 = session_settings::get_bool(psVar2,0x8026);
    if ((bVar7) && ((this->super_tracker_connection).m_req.private_torrent == false)) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&user_agent,"curl/7.81.0",(allocator<char> *)&ps);
    }
    else {
      psVar12 = session_settings::get_str_abi_cxx11_(psVar2,0);
      ::std::__cxx11::string::string((string *)&user_agent,(string *)psVar12);
    }
    ::std::__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> *)&ls,
               (__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_tracker_connection).m_req.outgoing_socket);
    plVar13 = listen_socket_handle::get(&ls);
    if (plVar13 == (listen_socket_t *)0x0) {
      bi.device._M_dataplus._M_p = (pointer)&bi.device.field_2;
      bi.device._M_string_length = 0;
      bi.device.field_2._M_allocated_capacity =
           bi.device.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bi.ip.type_ = ipv4;
      bi.ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      bi.ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      bi.ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      bi.ip.ipv6_address_.scope_id_ = 0;
    }
    else {
      listen_socket_handle::device_abi_cxx11_(&bi.device,&ls);
      listen_socket_handle::get_local_endpoint((endpoint *)&ps,&ls);
      if ((short)ps.hostname._M_dataplus._M_p != 2) {
        bi.ip.ipv6_address_.addr_.__in6_u._0_8_ = ps.hostname._M_string_length;
        bi.ip.ipv6_address_.addr_.__in6_u._8_8_ = ps.hostname.field_2._M_allocated_capacity;
        bi.ip.ipv6_address_.scope_id_ = ps.hostname.field_2._8_8_ & 0xffffffff;
        bi.ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        bi.ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        bi.ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        bi.ip.ipv6_address_.scope_id_ = 0;
        bi.ip.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(in4_addr_type)ps.hostname._M_dataplus._M_p._4_4_;
      }
      bi.ip.type_ = (uint)((short)ps.hostname._M_dataplus._M_p != 2);
    }
    proxy_settings::proxy_settings(&ps,psVar2);
    this_00 = (this->m_tracker_connection).
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    ps_00 = (proxy_settings *)0x0;
    if (ps.proxy_tracker_connections != false) {
      ps_00 = &ps;
    }
    ::std::_Optional_payload_base<libtorrent::aux::bind_info_t>::
    _Optional_payload_base<libtorrent::aux::bind_info_t&>
              ((_Optional_payload_base<libtorrent::aux::bind_info_t> *)&cb,&bi);
    eVar1 = (this->super_tracker_connection).m_req.event;
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"",(allocator<char> *)local_4a8);
    http_connection::get
              (this_00,&url,(time_duration)((long)iVar9 * 1000000000),ps_00,5,&user_agent,
               (optional<libtorrent::aux::bind_info_t> *)&cb,(resolver_flags)(eVar1 == stopped | 2),
               &local_468,(this->super_tracker_connection).m_req.i2pconn);
    ::std::__cxx11::string::~string((string *)&local_468);
    ::std::_Optional_payload_base<libtorrent::aux::bind_info_t>::_M_reset
              ((_Optional_payload_base<libtorrent::aux::bind_info_t> *)&cb);
    tracker_connection::sent_bytes(&this->super_tracker_connection,(int)url._M_string_length + 100);
    tracker_connection::requester((tracker_connection *)&cb);
    if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_vptr_request_callback[7])
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"==> TRACKER_REQUEST [ url: %s ]",url._M_dataplus._M_p);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    proxy_settings::~proxy_settings(&ps);
    ::std::__cxx11::string::~string((string *)&bi);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&ls.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__cxx11::string::~string((string *)&user_agent);
  }
  else {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&ps,invalid_listen_socket,(type *)0x0);
    tracker_connection::fail
              (&this->super_tracker_connection,(error_code *)&ps,get_interface,
               "outgoing socket was closed",(seconds32)0x0,(seconds32)0x0);
  }
LAB_001f8dfe:
  ::std::__cxx11::string::~string((string *)&url);
  return;
}

Assistant:

void http_tracker_connection::start()
	{
		std::string url = tracker_req().url;

		if (tracker_req().kind & tracker_request::scrape_request)
		{
			// find and replace "announce" with "scrape"
			// in request

			std::size_t pos = url.find("announce");
			if (pos == std::string::npos)
			{
				fail(errors::scrape_not_available, operation_t::bittorrent);
				return;
			}
			url.replace(pos, 8, "scrape");
		}

#if TORRENT_USE_I2P
		bool const i2p = is_i2p_url(url);
#else
		static const bool i2p = false;
#endif

		aux::session_settings const& settings = m_man.settings();

		// if request-string already contains
		// some parameters, append an ampersand instead
		// of a question mark
		auto const arguments_start = url.find('?');
		if (arguments_start != std::string::npos)
		{
			// tracker URLs that come pre-baked with query string arguments will be
			// rejected when SSRF-mitigation is enabled
			bool const ssrf_mitigation = settings.get_bool(settings_pack::ssrf_mitigation);
			if (ssrf_mitigation && has_tracker_query_string(string_view(url).substr(arguments_start + 1)))
			{
				fail(errors::ssrf_mitigation, operation_t::bittorrent);
				return;
			}
			url += "&";
		}
		else
		{
			url += "?";
		}

		url += "info_hash=";
		url += lt::escape_string({tracker_req().info_hash.data(), 20});

		if (!(tracker_req().kind & tracker_request::scrape_request))
		{
			static aux::array<const char*, 4> const event_string{{{"completed", "started", "stopped", "paused"}}};

			char str[1024];
			std::snprintf(str, sizeof(str)
				, "&peer_id=%s"
				"&port=%d"
				"&uploaded=%" PRId64
				"&downloaded=%" PRId64
				"&left=%" PRId64
				"&corrupt=%" PRId64
				"&key=%08X"
				"%s%s" // event
				"&numwant=%d"
				"&compact=1"
				"&no_peer_id=1"
				, lt::escape_string({tracker_req().pid.data(), 20}).c_str()
				// the i2p tracker seems to verify that the port is not 0,
				// even though it ignores it otherwise
				, tracker_req().listen_port
				, tracker_req().uploaded
				, tracker_req().downloaded
				, tracker_req().left
				, tracker_req().corrupt
				, tracker_req().key
				, (tracker_req().event != event_t::none) ? "&event=" : ""
				, (tracker_req().event != event_t::none) ? event_string[static_cast<int>(tracker_req().event) - 1] : ""
				, tracker_req().num_want);
			url += str;
#if !defined TORRENT_DISABLE_ENCRYPTION
			if (settings.get_int(settings_pack::in_enc_policy) != settings_pack::pe_disabled
				&& settings.get_bool(settings_pack::announce_crypto_support))
				url += "&supportcrypto=1";
#endif
			if (settings.get_bool(settings_pack::report_redundant_bytes))
			{
				url += "&redundant=";
				url += to_string(tracker_req().redundant).data();
			}
			if (!tracker_req().trackerid.empty())
			{
				url += "&trackerid=";
				url += lt::escape_string(tracker_req().trackerid);
			}

#if TORRENT_USE_I2P
			if (i2p && tracker_req().i2pconn)
			{
				if (tracker_req().i2pconn->local_endpoint().empty())
				{
					fail(errors::no_i2p_endpoint, operation_t::bittorrent
						, "Waiting for i2p acceptor from SAM bridge", seconds32(5));
					return;
				}
				else
				{
					url += "&ip=" + tracker_req().i2pconn->local_endpoint () + ".i2p";
				}
			}
			else
#endif
			if (!settings.get_bool(settings_pack::anonymous_mode))
			{
				std::string const& announce_ip = settings.get_str(settings_pack::announce_ip);
				if (!announce_ip.empty())
				{
					url += "&ip=" + lt::escape_string(announce_ip);
				}
			}
		}

		if (!tracker_req().ipv4.empty() && !i2p)
		{
			for (auto const& v4 : tracker_req().ipv4)
			{
				std::string const ip = v4.to_string();
				url += "&ipv4=";
				url += lt::escape_string(ip);
			}
		}
		if (!tracker_req().ipv6.empty() && !i2p)
		{
			for (auto const& v6 : tracker_req().ipv6)
			{
				std::string const ip = v6.to_string();
				url += "&ipv6=";
				url += lt::escape_string(ip);
			}
		}

		// i2p trackers don't use our outgoing sockets, they use the SAM
		// connection
		if (!i2p && !tracker_req().outgoing_socket)
		{
			fail(errors::invalid_listen_socket, operation_t::get_interface
				, "outgoing socket was closed");
			return;
		}

		using namespace std::placeholders;
		m_tracker_connection = std::make_shared<aux::http_connection>(m_ioc, m_man.host_resolver()
			, std::bind(&http_tracker_connection::on_response, shared_from_this(), _1, _2, _3)
			, true, settings.get_int(settings_pack::max_http_recv_buffer_size)
			, std::bind(&http_tracker_connection::on_connect, shared_from_this(), _1)
			, std::bind(&http_tracker_connection::on_filter, shared_from_this(), _1, _2)
			, std::bind(&http_tracker_connection::on_filter_hostname, shared_from_this(), _1, _2)
#if TORRENT_USE_SSL
			, tracker_req().ssl_ctx
#endif
			);

		int const timeout = tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout);

		// in anonymous mode we omit the user agent to mitigate fingerprinting of
		// the client. Private torrents is an exception because some private
		// trackers may require the user agent
		bool const anon_user = settings.get_bool(settings_pack::anonymous_mode)
			&& !tracker_req().private_torrent;
		std::string const user_agent = anon_user
			? "curl/7.81.0"
			: settings.get_str(settings_pack::user_agent);

		auto const ls = bind_socket();
		bind_info_t bi = [&ls](){
			if (ls.get() == nullptr)
				return bind_info_t{};
			else
				return bind_info_t{ls.device(), ls.get_local_endpoint().address()};
		}();

		// when sending stopped requests, prefer the cached DNS entry
		// to avoid being blocked for slow or failing responses. Chances
		// are that we're shutting down, and this should be a best-effort
		// attempt. It's not worth stalling shutdown.
		aux::proxy_settings ps(settings);
		m_tracker_connection->get(url, seconds(timeout)
			, ps.proxy_tracker_connections ? &ps : nullptr
			, 5, user_agent, bi
			, (tracker_req().event == event_t::stopped
				? aux::resolver_interface::cache_only : aux::resolver_flags{})
				| aux::resolver_interface::abort_on_shutdown
#if TORRENT_ABI_VERSION == 1
			, tracker_req().auth
#else
			, ""
#endif
#if TORRENT_USE_I2P
			, tracker_req().i2pconn
#endif
			);

		// the url + 100 estimated header size
		sent_bytes(int(url.size()) + 100);

#ifndef TORRENT_DISABLE_LOGGING

		std::shared_ptr<request_callback> cb = requester();
		if (cb)
		{
			cb->debug_log("==> TRACKER_REQUEST [ url: %s ]", url.c_str());
		}
#endif
	}